

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

EGLSurface
eglu::createWindowSurface
          (NativeDisplay *nativeDisplay,NativeWindow *window,EGLDisplay display,EGLConfig config,
          EGLAttrib *attribList)

{
  Capability CVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  EGLSurface pvVar8;
  TestError *pTVar9;
  InternalError *this_00;
  EGLConfig display_00;
  char *__s;
  bool bVar10;
  vector<int,_std::allocator<int>_> legacyAttribs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformExts;
  allocator<char> local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  EGLAttrib *local_88;
  pointer local_80;
  EGLDisplay local_78;
  EGLConfig local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50 [2];
  long local_40 [2];
  eglu *this;
  
  display_00 = config;
  local_88 = attribList;
  iVar4 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  this = (eglu *)CONCAT44(extraout_var,iVar4);
  CVar1 = window->m_capabilities;
  if ((CVar1 & (CAPABILITY_CREATE_SURFACE_PLATFORM|CAPABILITY_CREATE_SURFACE_LEGACY)) == 0) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,(char *)0x0,"supportsLegacyCreate || supportsPlatformCreate",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x120);
  }
  else {
    if ((CVar1 & CAPABILITY_CREATE_SURFACE_PLATFORM) != 0) {
      local_78 = display;
      local_70 = config;
      getExtensions_abi_cxx11_(&local_68,this,(Library *)0x0,display_00);
      pbVar3 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"EGL_EXT_platform_base","");
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar2,pbVar3,&local_a8);
      if (_Var6._M_current == pbVar3) {
        bVar10 = false;
      }
      else {
        __s = (char *)(nativeDisplay->m_platformExtension)._M_string_length;
        if (__s != (char *)0x0) {
          __s = (nativeDisplay->m_platformExtension)._M_dataplus._M_p;
        }
        local_80 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_a9);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_80,local_68.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,local_50);
        bVar10 = _Var7._M_current !=
                 local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      config = local_70;
      display = local_78;
      if ((_Var6._M_current != pbVar3) && (local_50[0] != local_40)) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((pointer *)
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if (bVar10) {
        toLegacyAttribList(&local_a8,local_88);
        iVar4 = (*window->_vptr_NativeWindow[3])(window);
        pvVar8 = (EGLSurface)
                 (**(code **)(*(long *)this + 0x78))
                           (this,display,config,iVar4,
                            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
        dVar5 = (**(code **)(*(long *)this + 0xf8))(this);
        checkError(dVar5,"eglCreatePlatformWindowSurfaceEXT()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x12f);
        if (pvVar8 == (EGLSurface)0x0) {
          pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar9,(char *)0x0,"surface != EGL_NO_SURFACE",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                     ,0x130);
          __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        goto LAB_0017a239;
      }
    }
    if ((CVar1 & CAPABILITY_CREATE_SURFACE_LEGACY) != 0) {
      toLegacyAttribList(&local_a8,local_88);
      iVar4 = (*window->_vptr_NativeWindow[2])(window);
      pvVar8 = (EGLSurface)
               (**(code **)(*(long *)this + 0x90))
                         (this,display,config,iVar4,
                          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      dVar5 = (**(code **)(*(long *)this + 0xf8))(this);
      checkError(dVar5,"eglCreateWindowSurface()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x136);
      if (pvVar8 == (EGLSurface)0x0) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,(char *)0x0,"surface != EGL_NO_SURFACE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x137);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
LAB_0017a239:
      if ((pointer *)
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return pvVar8;
    }
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"No supported way to create EGL window surface",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x13a);
  }
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

EGLSurface createWindowSurface (NativeDisplay& nativeDisplay, NativeWindow& window, EGLDisplay display, EGLConfig config, const EGLAttrib* attribList)
{
	const Library&	egl							= nativeDisplay.getLibrary();
	const bool		supportsLegacyCreate		= (window.getCapabilities() & NativeWindow::CAPABILITY_CREATE_SURFACE_LEGACY) != 0;
	const bool		supportsPlatformCreate		= (window.getCapabilities() & NativeWindow::CAPABILITY_CREATE_SURFACE_PLATFORM) != 0;
	bool			usePlatformExt				= false;
	EGLSurface		surface						= EGL_NO_SURFACE;

	TCU_CHECK_INTERNAL(supportsLegacyCreate || supportsPlatformCreate);

	if (supportsPlatformCreate)
	{
		const vector<string> platformExts = getClientExtensions(egl);
		usePlatformExt = de::contains(platformExts.begin(), platformExts.end(), string("EGL_EXT_platform_base")) &&
						 de::contains(platformExts.begin(), platformExts.end(), string(nativeDisplay.getPlatformExtensionName()));
	}

	// \todo [2014-03-13 pyry] EGL 1.5 core support
	if (usePlatformExt)
	{
		const vector<EGLint>	legacyAttribs	= toLegacyAttribList(attribList);

		surface = egl.createPlatformWindowSurfaceEXT(display, config, window.getPlatformNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglCreatePlatformWindowSurfaceEXT()");
		TCU_CHECK(surface != EGL_NO_SURFACE);
	}
	else if (supportsLegacyCreate)
	{
		const vector<EGLint> legacyAttribs = toLegacyAttribList(attribList);
		surface = egl.createWindowSurface(display, config, window.getLegacyNative(), &legacyAttribs[0]);
		EGLU_CHECK_MSG(egl, "eglCreateWindowSurface()");
		TCU_CHECK(surface != EGL_NO_SURFACE);
	}
	else
		throw tcu::InternalError("No supported way to create EGL window surface", DE_NULL, __FILE__, __LINE__);

	DE_ASSERT(surface != EGL_NO_SURFACE);
	return surface;
}